

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

void __thiscall File::executeParse(File *this)

{
  TSInput input;
  Snapshot *this_00;
  TSTree *pTVar1;
  undefined4 uStack_4c;
  vector<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
  chunks;
  TextBufferInput textBufferInput;
  
  this_00 = TextBuffer::create_snapshot(&this->buffer);
  TextBuffer::Snapshot::primitive_chunks(&chunks,this_00);
  textBufferInput.byte_offset = 0;
  textBufferInput.slice_index_ = 0;
  textBufferInput.slice_offset_ = 0;
  input._20_4_ = uStack_4c;
  input.encoding = 1;
  input.read = TextBufferInput::Read;
  input.payload = &textBufferInput;
  textBufferInput.slices_ = &chunks;
  pTVar1 = ts_parser_parse(this->parser,this->tree,input);
  this->tree = pTVar1;
  TextBuffer::Snapshot::~Snapshot(this_00);
  operator_delete(this_00,0x18);
  std::
  _Vector_base<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
  ::~_Vector_base(&chunks.
                   super__Vector_base<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
                 );
  return;
}

Assistant:

void File::executeParse () {
    auto snapshot = buffer.create_snapshot(); // NOTE: Looks like this can be done without creating a snapshot

    auto chunks = snapshot->primitive_chunks();

    TextBufferInput textBufferInput { &chunks };

    tree = ts_parser_parse(parser, tree, textBufferInput.input());

//    std::cerr << "tree:\n";
//    std::cerr << ts_node_string(ts_tree_root_node(tree)) << "\n";

    delete snapshot;
}